

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall Plan::Dump(Plan *this)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  size_type sVar4;
  _Self local_20;
  _Self local_18;
  const_iterator e;
  Plan *this_local;
  
  e._M_node = (_Base_ptr)this;
  sVar2 = std::
          map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
          ::size(&this->want_);
  printf("pending: %d\n",sVar2 & 0xffffffff);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
       ::begin(&this->want_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
         ::end(&this->want_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       (&local_18);
    if (ppVar3->second != kWantNothing) {
      printf("want ");
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       (&local_18);
    Edge::Dump(ppVar3->first,"");
    std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator++(&local_18);
  }
  sVar4 = std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::size(&this->ready_);
  printf("ready: %d\n",sVar4 & 0xffffffff);
  return;
}

Assistant:

void Plan::Dump() const {
  printf("pending: %d\n", (int)want_.size());
  for (map<Edge*, Want>::const_iterator e = want_.begin(); e != want_.end(); ++e) {
    if (e->second != kWantNothing)
      printf("want ");
    e->first->Dump();
  }
  printf("ready: %d\n", (int)ready_.size());
}